

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

ssize_t __thiscall
Liby::Socket::sendfile(Socket *this,int __out_fd,int __in_fd,off_t *__offset,size_t __count)

{
  ssize_t sVar1;
  undefined4 in_register_00000014;
  
  sVar1 = ::sendfile(this->fd_,__out_fd,(off_t *)CONCAT44(in_register_00000014,__in_fd),
                     (size_t)__offset);
  return sVar1;
}

Assistant:

int sendfile(int in_fd, off_t *offset, size_t count) {
#ifdef __linux__
        return ::sendfile(fd_, in_fd, offset, count);
#elif defined(__APPLE__)
        off_t len = static_cast<off_t>(count);
        return ::sendfile(in_fd, fd_, *offset, &len, nullptr, 0);
#endif
    }